

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbm-xs.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  ulong uVar1;
  kbm loaded_kbm;
  ifstream test_kbm;
  kbm local_248;
  ifstream local_210 [520];
  
  std::ifstream::ifstream(local_210);
  std::ifstream::open((char *)local_210,0x120010);
  scala::read_kbm(&local_248,local_210);
  if (local_248.map_size != 0xc) {
    __assert_fail("loaded_kbm.map_size == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x15,"int main(int, char **)");
  }
  if (local_248.first_note != 0) {
    __assert_fail("loaded_kbm.first_note == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x16,"int main(int, char **)");
  }
  if (local_248.last_note != 0x7f) {
    __assert_fail("loaded_kbm.last_note == 127",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x17,"int main(int, char **)");
  }
  if (local_248.middle_note == 0x3c) {
    if (local_248.reference_note != 0x45) {
      __assert_fail("loaded_kbm.reference_note == 69",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                    ,0x19,"int main(int, char **)");
    }
    if ((local_248.reference_frequency == 440.0) && (!NAN(local_248.reference_frequency))) {
      if (local_248.octave_degree != 0xc) {
        __assert_fail("loaded_kbm.octave_degree == 12",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                      ,0x1b,"int main(int, char **)");
      }
      uVar1 = 0;
      do {
        if ((uVar1 & 1) == 0) {
          if (uVar1 != (long)local_248.mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar1]) {
            __assert_fail("loaded_kbm.mapping[i] == i",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                          ,0x1f,"int main(int, char **)");
          }
        }
        else if (local_248.mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar1] != -1) {
          __assert_fail("loaded_kbm.mapping[i] == KBM_NON_ENTRY",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                        ,0x21,"int main(int, char **)");
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 != 0xc);
      std::ifstream::close();
      scala::kbm::~kbm(&local_248);
      std::ifstream::~ifstream(local_210);
      return 0;
    }
    __assert_fail("loaded_kbm.reference_frequency == 440.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                  ,0x1a,"int main(int, char **)");
  }
  __assert_fail("loaded_kbm.middle_note == 60",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/kbm-xs.cpp"
                ,0x18,"int main(int, char **)");
}

Assistant:

int main(int, char**) {
  ifstream test_kbm; 
  test_kbm.open("kbm/12-tet-xs.kbm");
  scala::kbm loaded_kbm = scala::read_kbm(test_kbm);

  /*
    This test ensures that x's are honored in the KBM 
    file.
  */

  assert(loaded_kbm.map_size == 12);
  assert(loaded_kbm.first_note == 0);
  assert(loaded_kbm.last_note == 127);
  assert(loaded_kbm.middle_note == 60);
  assert(loaded_kbm.reference_note == 69);
  assert(loaded_kbm.reference_frequency == 440.0);
  assert(loaded_kbm.octave_degree == 12);

  for (size_t i = 0; i < 12; i++){
    if (i % 2 == 0){
      assert(loaded_kbm.mapping[i] == i);
    } else {
      assert(loaded_kbm.mapping[i] == KBM_NON_ENTRY);
    }
  }

  test_kbm.close();
  return 0;
}